

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O1

aiScene * __thiscall Assimp::Importer::ReadFile(Importer *this,char *_pFile,uint pFlags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IOSystem *pIVar2;
  char *__s;
  ProgressHandler *pPVar3;
  bool bVar4;
  size_type sVar5;
  _Head_base<0UL,_Assimp::Profiling::Profiler_*,_false> _Var6;
  int iVar7;
  Logger *pLVar8;
  int *piVar9;
  Profiler *this_00;
  _Rb_tree_header *p_Var10;
  long lVar11;
  ImporterPimpl *pIVar12;
  undefined4 extraout_var;
  ulong uVar13;
  undefined4 extraout_var_00;
  long *plVar14;
  aiScene *paVar15;
  size_type *psVar16;
  pointer ppBVar17;
  BaseImporter *this_01;
  ValidateDSProcess ds;
  string ext;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  profiler;
  string pFile;
  ScenePreprocessor pre;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  _Head_base<0UL,_Assimp::Profiling::Profiler_*,_false> local_78;
  string local_70;
  undefined1 local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,_pFile,(allocator<char> *)&local_98);
  WriteLogOpening(&local_70);
  if (this->pimpl->mScene != (aiScene *)0x0) {
    pLVar8 = DefaultLogger::get();
    Logger::debug(pLVar8,"(Deleting previous scene)");
    FreeScene(this);
  }
  pIVar2 = this->pimpl->mIOHandler;
  iVar7 = (*pIVar2->_vptr_IOSystem[2])(pIVar2,local_70._M_dataplus._M_p);
  if ((char)iVar7 == '\0') {
    std::operator+(&local_b8,"Unable to open file \"",&local_70);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar16 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_98.field_2._M_allocated_capacity = *psVar16;
      local_98.field_2._8_8_ = plVar14[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar16;
      local_98._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_98._M_string_length = plVar14[1];
    *plVar14 = (long)psVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    pLVar8 = DefaultLogger::get();
    Logger::error(pLVar8,(this->pimpl->mErrorString)._M_dataplus._M_p);
    bVar4 = false;
    goto LAB_002f3c80;
  }
  local_98._M_dataplus._M_p = (pointer)((ulong)local_98._M_dataplus._M_p._4_4_ << 0x20);
  piVar9 = GetGenericProperty<int>
                     (&this->pimpl->mIntProperties,"GLOB_MEASURE_TIME",(int *)&local_98);
  if (*piVar9 == 0) {
    this_00 = (Profiler *)0x0;
  }
  else {
    this_00 = (Profiler *)operator_new(0x30);
    p_Var10 = &(this_00->regions)._M_t._M_impl.super__Rb_tree_header;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var10->_M_header;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var10->_M_header;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  local_78._M_head_impl = this_00;
  if (this_00 != (Profiler *)0x0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"total","");
    Profiling::Profiler::BeginRegion(this_00,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  SetPropertyInteger(this,"importerIndex",-1);
  pIVar12 = this->pimpl;
  ppBVar17 = (pIVar12->mImporter).
             super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  this_01 = (BaseImporter *)0x0;
  if ((pIVar12->mImporter).
      super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar17) {
    uVar13 = 0;
    do {
      iVar7 = (*ppBVar17[uVar13]->_vptr_BaseImporter[3])
                        (ppBVar17[uVar13],&local_70,pIVar12->mIOHandler,0);
      if ((char)iVar7 != '\0') {
        this_01 = (this->pimpl->mImporter).
                  super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar13];
        SetPropertyInteger(this,"importerIndex",(int)uVar13);
        break;
      }
      uVar13 = (ulong)((int)uVar13 + 1);
      pIVar12 = this->pimpl;
      ppBVar17 = (pIVar12->mImporter).
                 super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(pIVar12->mImporter).
                                    super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar17 >> 3
                             ));
  }
  if (this_01 == (BaseImporter *)0x0) {
    lVar11 = std::__cxx11::string::rfind((char)&local_70,0x2e);
    if (lVar11 == -1) {
      this_01 = (BaseImporter *)0x0;
    }
    else {
      pLVar8 = DefaultLogger::get();
      Logger::info(pLVar8,"File extension not known, trying signature-based detection");
      pIVar12 = this->pimpl;
      ppBVar17 = (pIVar12->mImporter).
                 super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_01 = (BaseImporter *)0x0;
      if ((pIVar12->mImporter).
          super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppBVar17) {
        uVar13 = 0;
        do {
          iVar7 = (*ppBVar17[uVar13]->_vptr_BaseImporter[3])
                            (ppBVar17[uVar13],&local_70,pIVar12->mIOHandler,1);
          if ((char)iVar7 != '\0') {
            this_01 = (this->pimpl->mImporter).
                      super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar13];
            SetPropertyInteger(this,"importerIndex",(int)uVar13);
            break;
          }
          uVar13 = (ulong)((int)uVar13 + 1);
          pIVar12 = this->pimpl;
          ppBVar17 = (pIVar12->mImporter).
                     super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar13 < (ulong)((long)(pIVar12->mImporter).
                                        super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar17
                                 >> 3));
      }
    }
    if (this_01 != (BaseImporter *)0x0) goto LAB_002f37bb;
    std::operator+(&local_b8,"No suitable reader found for the file format of file \"",&local_70);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar16 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_98.field_2._M_allocated_capacity = *psVar16;
      local_98.field_2._8_8_ = plVar14[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar16;
      local_98._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_98._M_string_length = plVar14[1];
    *plVar14 = (long)psVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    pLVar8 = DefaultLogger::get();
    Logger::error(pLVar8,(this->pimpl->mErrorString)._M_dataplus._M_p);
    bVar4 = false;
  }
  else {
LAB_002f37bb:
    pIVar2 = this->pimpl->mIOHandler;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"rb","");
    iVar7 = (*pIVar2->_vptr_IOSystem[4])(pIVar2,local_70._M_dataplus._M_p,local_98._M_dataplus._M_p)
    ;
    plVar14 = (long *)CONCAT44(extraout_var,iVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (plVar14 == (long *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (**(code **)(*plVar14 + 0x30))(plVar14);
      pIVar2 = this->pimpl->mIOHandler;
      (*pIVar2->_vptr_IOSystem[5])(pIVar2,plVar14);
    }
    iVar7 = (*this_01->_vptr_BaseImporter[5])(this_01);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"unknown","");
    sVar5 = local_98._M_string_length;
    if ((undefined8 *)CONCAT44(extraout_var_00,iVar7) != (undefined8 *)0x0) {
      __s = *(char **)CONCAT44(extraout_var_00,iVar7);
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)sVar5,(ulong)__s);
    }
    pLVar8 = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "Found a matching importer for this file format: ",&local_98);
    plVar14 = (long *)std::__cxx11::string::append(local_50);
    paVar1 = &local_b8.field_2;
    psVar16 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_b8.field_2._M_allocated_capacity = *psVar16;
      local_b8.field_2._8_8_ = plVar14[3];
      local_b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar16;
      local_b8._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_b8._M_string_length = plVar14[1];
    *plVar14 = (long)psVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    Logger::info(pLVar8,local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((aiScene *)local_50._0_8_ != (aiScene *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
    pPVar3 = this->pimpl->mProgressHandler;
    (*pPVar3->_vptr_ProgressHandler[3])(pPVar3,0,uVar13 & 0xffffffff);
    _Var6._M_head_impl = local_78._M_head_impl;
    if (local_78._M_head_impl != (Profiler *)0x0) {
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"import","");
      Profiling::Profiler::BeginRegion(_Var6._M_head_impl,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    paVar15 = BaseImporter::ReadFile(this_01,this,&local_70,this->pimpl->mIOHandler);
    this->pimpl->mScene = paVar15;
    pPVar3 = this->pimpl->mProgressHandler;
    (*pPVar3->_vptr_ProgressHandler[3])(pPVar3,uVar13 & 0xffffffff,uVar13 & 0xffffffff);
    _Var6._M_head_impl = local_78._M_head_impl;
    if (local_78._M_head_impl != (Profiler *)0x0) {
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"import","");
      Profiling::Profiler::EndRegion(_Var6._M_head_impl,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    SetPropertyString(this,"sourceFilePath",&local_70);
    if (this->pimpl->mScene == (aiScene *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->pimpl->mErrorString);
LAB_002f3b34:
      SharedPostProcessInfo::Clean(this->pimpl->mPPShared);
      _Var6._M_head_impl = local_78._M_head_impl;
      bVar4 = true;
      if (local_78._M_head_impl != (Profiler *)0x0) {
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"total","");
        Profiling::Profiler::EndRegion(_Var6._M_head_impl,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      if ((pFlags >> 10 & 1) == 0) {
LAB_002f3a76:
        _Var6._M_head_impl = local_78._M_head_impl;
        if (local_78._M_head_impl != (Profiler *)0x0) {
          local_b8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"preprocess","");
          Profiling::Profiler::BeginRegion(_Var6._M_head_impl,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        local_50._0_8_ = this->pimpl->mScene;
        ScenePreprocessor::ProcessScene((ScenePreprocessor *)local_50);
        _Var6._M_head_impl = local_78._M_head_impl;
        if (local_78._M_head_impl != (Profiler *)0x0) {
          local_b8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"preprocess","");
          Profiling::Profiler::EndRegion(_Var6._M_head_impl,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        ApplyPostProcessing(this,pFlags & 0xfffffbff);
        goto LAB_002f3b34;
      }
      ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)&local_b8);
      BaseProcess::ExecuteOnScene((BaseProcess *)&local_b8,this);
      paVar15 = this->pimpl->mScene;
      ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)&local_b8);
      if (paVar15 != (aiScene *)0x0) goto LAB_002f3a76;
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>::
  ~unique_ptr((unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               *)&local_78);
LAB_002f3c80:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    paVar15 = this->pimpl->mScene;
  }
  else {
    paVar15 = (aiScene *)0x0;
  }
  return paVar15;
}

Assistant:

const aiScene* Importer::ReadFile( const char* _pFile, unsigned int pFlags)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
    const std::string pFile(_pFile);

    // ----------------------------------------------------------------------
    // Put a large try block around everything to catch all std::exception's
    // that might be thrown by STL containers or by new().
    // ImportErrorException's are throw by ourselves and caught elsewhere.
    //-----------------------------------------------------------------------

    WriteLogOpening(pFile);

#ifdef ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    try
#endif // ! ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    {
        // Check whether this Importer instance has already loaded
        // a scene. In this case we need to delete the old one
        if (pimpl->mScene)  {

            ASSIMP_LOG_DEBUG("(Deleting previous scene)");
            FreeScene();
        }

        // First check if the file is accessible at all
        if( !pimpl->mIOHandler->Exists( pFile)) {

            pimpl->mErrorString = "Unable to open file \"" + pFile + "\".";
            ASSIMP_LOG_ERROR(pimpl->mErrorString);
            return NULL;
        }

        std::unique_ptr<Profiler> profiler(GetPropertyInteger(AI_CONFIG_GLOB_MEASURE_TIME,0)?new Profiler():NULL);
        if (profiler) {
            profiler->BeginRegion("total");
        }

        // Find an worker class which can handle the file
        BaseImporter* imp = NULL;
        SetPropertyInteger("importerIndex", -1);
        for( unsigned int a = 0; a < pimpl->mImporter.size(); a++)  {

            if( pimpl->mImporter[a]->CanRead( pFile, pimpl->mIOHandler, false)) {
                imp = pimpl->mImporter[a];
                SetPropertyInteger("importerIndex", a);
                break;
            }
        }

        if (!imp)   {
            // not so bad yet ... try format auto detection.
            const std::string::size_type s = pFile.find_last_of('.');
            if (s != std::string::npos) {
                ASSIMP_LOG_INFO("File extension not known, trying signature-based detection");
                for( unsigned int a = 0; a < pimpl->mImporter.size(); a++)  {
                    if( pimpl->mImporter[a]->CanRead( pFile, pimpl->mIOHandler, true)) {
                        imp = pimpl->mImporter[a];
                        SetPropertyInteger("importerIndex", a);
                        break;
                    }
                }
            }
            // Put a proper error message if no suitable importer was found
            if( !imp)   {
                pimpl->mErrorString = "No suitable reader found for the file format of file \"" + pFile + "\".";
                ASSIMP_LOG_ERROR(pimpl->mErrorString);
                return NULL;
            }
        }

        // Get file size for progress handler
        IOStream * fileIO = pimpl->mIOHandler->Open( pFile );
        uint32_t fileSize = 0;
        if (fileIO)
        {
            fileSize = static_cast<uint32_t>(fileIO->FileSize());
            pimpl->mIOHandler->Close( fileIO );
        }

        // Dispatch the reading to the worker class for this format
        const aiImporterDesc *desc( imp->GetInfo() );
        std::string ext( "unknown" );
        if ( NULL != desc ) {
            ext = desc->mName;
        }
        ASSIMP_LOG_INFO("Found a matching importer for this file format: " + ext + "." );
        pimpl->mProgressHandler->UpdateFileRead( 0, fileSize );

        if (profiler) {
            profiler->BeginRegion("import");
        }

        pimpl->mScene = imp->ReadFile( this, pFile, pimpl->mIOHandler);
        pimpl->mProgressHandler->UpdateFileRead( fileSize, fileSize );

        if (profiler) {
            profiler->EndRegion("import");
        }

        SetPropertyString("sourceFilePath", pFile);

        // If successful, apply all active post processing steps to the imported data
        if( pimpl->mScene)  {

#ifndef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
            // The ValidateDS process is an exception. It is executed first, even before ScenePreprocessor is called.
            if (pFlags & aiProcess_ValidateDataStructure)
            {
                ValidateDSProcess ds;
                ds.ExecuteOnScene (this);
                if (!pimpl->mScene) {
                    return NULL;
                }
            }
#endif // no validation

            // Preprocess the scene and prepare it for post-processing
            if (profiler) {
                profiler->BeginRegion("preprocess");
            }

            ScenePreprocessor pre(pimpl->mScene);
            pre.ProcessScene();

            if (profiler) {
                profiler->EndRegion("preprocess");
            }

            // Ensure that the validation process won't be called twice
            ApplyPostProcessing(pFlags & (~aiProcess_ValidateDataStructure));
        }
        // if failed, extract the error string
        else if( !pimpl->mScene) {
            pimpl->mErrorString = imp->GetErrorText();
        }

        // clear any data allocated by post-process steps
        pimpl->mPPShared->Clean();

        if (profiler) {
            profiler->EndRegion("total");
        }
    }
#ifdef ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    catch (std::exception &e)
    {
#if (defined _MSC_VER) &&   (defined _CPPRTTI)
        // if we have RTTI get the full name of the exception that occurred
        pimpl->mErrorString = std::string(typeid( e ).name()) + ": " + e.what();
#else
        pimpl->mErrorString = std::string("std::exception: ") + e.what();
#endif

        ASSIMP_LOG_ERROR(pimpl->mErrorString);
        delete pimpl->mScene; pimpl->mScene = NULL;
    }
#endif // ! ASSIMP_CATCH_GLOBAL_EXCEPTIONS

    // either successful or failure - the pointer expresses it anyways
    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    return pimpl->mScene;
}